

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDecoder.cpp
# Opt level: O3

DecoderResult * ZXing::DataMatrix::DoDecode(DecoderResult *__return_storage_ptr__,BitMatrix *bits)

{
  pointer puVar1;
  pointer puVar2;
  size_type sVar3;
  bool bVar4;
  SymbologyIdentifier SVar5;
  undefined8 *puVar6;
  uint uVar7;
  bool bVar8;
  byte val;
  uint8_t uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  const_iterator __begin0;
  Version *version;
  DecoderResult *pDVar16;
  pointer pDVar17;
  GenericGF *field;
  undefined7 extraout_var;
  ulong uVar18;
  undefined1 *puVar19;
  long *plVar20;
  DecoderResult *extraout_RAX;
  DecoderResult *extraout_RAX_00;
  DecoderResult *extraout_RAX_01;
  DecoderResult *extraout_RAX_02;
  DecoderResult *extraout_RAX_03;
  DecoderResult *extraout_RAX_04;
  DecoderResult *extraout_RAX_05;
  bool bVar21;
  char cVar22;
  int iVar23;
  const_iterator __end0;
  long lVar24;
  int iVar25;
  char cVar26;
  size_type __n;
  ulong uVar27;
  uchar *puVar28;
  uint __len;
  char *pcVar29;
  ulong uVar30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  ulong uVar32;
  BitSource bits_1;
  Content result;
  vector<int,_std::allocator<int>_> codewordsInts;
  string resultTrailer;
  StructuredAppendInfo sai;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> dataBlocks;
  Error error;
  ByteArray resultBytes;
  ByteArray codewords;
  BitSource local_610;
  DecoderResult *local_600;
  Content local_5f8;
  DecoderResult *local_5c0;
  string local_5b8;
  pointer pEStack_598;
  pointer local_590;
  SymbologyIdentifier local_588;
  CharacterSet local_584;
  bool bStack_583;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_580;
  size_type local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  undefined8 local_560;
  undefined1 auStack_558 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_550;
  size_type local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  undefined2 local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_528;
  size_type local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  undefined8 local_508;
  undefined2 uStack_500;
  undefined1 uStack_4fe;
  element_type *local_4f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4f0;
  Version *local_4e0;
  uint local_4d4;
  uint *local_4d0;
  long local_4c8;
  uint local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  uint *local_4b0;
  long local_4a8;
  uint local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  uint *local_490;
  long local_488;
  uint local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  uint *local_470;
  long local_468;
  uint local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  uint *local_450;
  long local_448;
  uint local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  uint *local_430;
  long local_428;
  uint local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  uint *local_410;
  long local_408;
  uint local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  uint *local_3f0;
  long local_3e8;
  uint local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  uint *local_3d0;
  long local_3c8;
  uint local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  uint *local_3b0;
  long local_3a8;
  uint local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined1 *local_390;
  long local_388;
  undefined1 local_380;
  undefined7 uStack_37f;
  uint *local_370;
  long local_368;
  uint local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined1 local_350 [8];
  undefined1 *local_348;
  undefined8 local_340;
  undefined1 local_338;
  undefined7 uStack_337;
  undefined8 *local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_320;
  undefined8 local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8;
  undefined7 uStack_2a7;
  undefined7 local_298;
  undefined1 uStack_291;
  undefined2 uStack_290;
  undefined1 uStack_28e;
  uchar *local_288;
  undefined8 local_280;
  uchar local_278;
  uint7 uStack_277;
  undefined8 uStack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  _Optional_payload_base<std::array<int,_3UL>_> local_248;
  _Optional_payload_base<std::array<int,_3UL>_> local_238;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_228;
  char **local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  ByteArray local_200;
  long *local_1e8 [2];
  long local_1d8 [2];
  Error local_1c8;
  DecoderResult local_198;
  Error local_c0;
  Error local_90;
  Error local_60;
  
  local_600 = __return_storage_ptr__;
  version = VersionForDimensions(bits->_height,bits->_width);
  if (version == (Version *)0x0) {
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"Invalid matrix dimension","");
    paVar31 = &local_60._msg.field_2;
    if (local_268 == &local_258) {
      local_60._msg.field_2._8_8_ = local_258._8_8_;
      local_60._msg._M_dataplus._M_p = (pointer)paVar31;
    }
    else {
      local_60._msg._M_dataplus._M_p = (pointer)local_268;
    }
    local_60._msg.field_2._M_allocated_capacity._1_7_ = local_258._M_allocated_capacity._1_7_;
    local_60._msg.field_2._M_local_buf[0] = local_258._M_local_buf[0];
    local_60._msg._M_string_length = local_260;
    local_260 = 0;
    local_258._M_local_buf[0] = '\0';
    local_60._file = "src/datamatrix/DMDecoder.cpp";
    local_60._line = 0x188;
    local_60._type = Format;
    local_268 = &local_258;
    DecoderResult::DecoderResult(local_600,&local_60);
    pDVar16 = extraout_RAX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._msg._M_dataplus._M_p != paVar31) {
      operator_delete(local_60._msg._M_dataplus._M_p,local_60._msg.field_2._M_allocated_capacity + 1
                     );
      pDVar16 = extraout_RAX_00;
    }
    if (local_268 == &local_258) {
      return pDVar16;
    }
    uVar27 = CONCAT71(local_258._M_allocated_capacity._1_7_,local_258._M_local_buf[0]) + 1;
    local_200.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_268;
  }
  else {
    CodewordsFromBitMatrix(&local_200,bits,version);
    if (local_200.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_200.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_320 = &local_518;
      local_328 = &local_508;
      local_208 = &local_198._error._msg.field_2;
      local_210 = &local_198._error._file;
      pDVar16 = (DecoderResult *)0x0;
      local_4e0 = version;
LAB_0014e41b:
      local_5c0 = pDVar16;
      GetDataBlocks(&local_2f0,&local_200,version,(bool)((byte)pDVar16 & 1));
      if (local_2f0.
          super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2f0.
          super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __n = 0;
        pDVar17 = local_2f0.
                  super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          __n = (long)(int)__n + (long)pDVar17->numDataCodewords;
          pDVar17 = pDVar17 + 1;
        } while (pDVar17 !=
                 local_2f0.
                 super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        local_5b8._M_dataplus._M_p = local_5b8._M_dataplus._M_p & 0xffffffffffffff00;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_228,__n,(value_type_conflict *)&local_5b8,(allocator_type *)&local_198);
        uVar11 = (uint)((ulong)((long)local_2f0.
                                      super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2f0.
                                     super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
        if (0 < (int)uVar11) {
          uVar27 = (ulong)(uVar11 & 0x7fffffff);
          uVar32 = 0;
          do {
            pDVar17 = local_2f0.
                      super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar11 = local_2f0.
                     super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar32].numDataCodewords;
            std::vector<int,std::allocator<int>>::
            vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      ((vector<int,std::allocator<int>> *)&local_5b8,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_2f0.
                         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar32].codewords.
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_2f0.
                         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar32].codewords.
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish,(allocator_type *)&local_198);
            pDVar17 = pDVar17 + uVar32;
            puVar1 = (pDVar17->codewords).
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar2 = (pDVar17->codewords).
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            field = GenericGF::DataMatrixField256();
            bVar8 = ReedSolomonDecode(field,(vector<int,_std::allocator<int>_> *)&local_5b8,
                                      ((int)puVar2 - (int)puVar1) - uVar11);
            uVar18 = CONCAT71(extraout_var,bVar8) & 0xffffffff;
            if ((bVar8) && (0 < (int)uVar11)) {
              puVar1 = (pDVar17->codewords).
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar30 = (ulong)uVar11 + 1;
              lVar24 = 0;
              do {
                puVar1[lVar24] = local_5b8._M_dataplus._M_p[lVar24 * 4];
                uVar30 = uVar30 - 1;
                lVar24 = lVar24 + 1;
              } while (1 < uVar30);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b8._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_5b8._M_dataplus._M_p,
                              local_5b8.field_2._M_allocated_capacity -
                              (long)local_5b8._M_dataplus._M_p);
            }
            version = local_4e0;
            if ((char)uVar18 == '\0') {
              pDVar16 = (DecoderResult *)CONCAT71((int7)(uVar18 >> 8),1);
              bVar8 = true;
              paVar31 = &local_1c8._msg.field_2;
              if (local_4e0->versionNumber == 0x18 && ((ulong)local_5c0 & 1) == 0)
              goto LAB_0015015a;
              local_288 = &local_278;
              local_1c8._msg.field_2._M_allocated_capacity = (ulong)uStack_277 << 8;
              local_1c8._msg.field_2._8_8_ = uStack_270;
              local_1c8._msg._M_string_length = 0;
              local_280 = 0;
              local_278 = '\0';
              local_1c8._file = "src/datamatrix/DMDecoder.cpp";
              local_1c8._line = 0x1a2;
              local_1c8._type = Checksum;
              local_1c8._msg._M_dataplus._M_p = (pointer)paVar31;
              DecoderResult::DecoderResult(local_600,&local_1c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._msg._M_dataplus._M_p != paVar31) {
                operator_delete(local_1c8._msg._M_dataplus._M_p,
                                local_1c8._msg.field_2._M_allocated_capacity + 1);
              }
              if (local_288 == &local_278) goto LAB_00150151;
              uVar27 = CONCAT71(uStack_277,local_278) + 1;
              puVar28 = local_288;
              goto LAB_0015014c;
            }
            if (0 < pDVar17->numDataCodewords) {
              lVar24 = 0;
              uVar18 = uVar32;
              do {
                local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar18] =
                     (pDVar17->codewords).
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar24];
                lVar24 = lVar24 + 1;
                uVar18 = uVar18 + uVar27;
              } while (lVar24 < pDVar17->numDataCodewords);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar27);
        }
        iVar10 = local_4e0->versionNumber;
        local_610._bytes = (ByteArray *)&local_228;
        local_610._byteOffset = 0;
        local_610._bitOffset = 0;
        Content::Content(&local_5f8);
        local_4d4 = iVar10 - 0x1f;
        local_2b8 = &local_2a8;
        bVar21 = false;
        local_2b0 = 0;
        local_2a8 = 0;
        local_298 = 0;
        uStack_291 = 0;
        uStack_290 = 0xffff;
        uStack_28e = 0;
        local_5f8.symbology.code = 'd';
        local_5f8.symbology.modifier = '1';
        local_5f8.symbology.eciModifierOffset = '\x03';
        local_5f8.symbology.aiFlag = None;
        local_390 = &local_380;
        local_388 = 0;
        local_380 = 0;
        local_350._0_4_ = -1;
        local_350._4_4_ = -1;
        local_348 = &local_338;
        local_340 = 0;
        local_338 = 0;
        local_318 = 1;
        cVar26 = '\0';
        bVar8 = true;
switchD_0014e6a9_caseD_eb:
        bVar4 = bVar8;
        cVar22 = cVar26;
        paVar31 = &local_5b8.field_2;
        iVar10 = BitSource::available(&local_610);
        if (iVar10 < 8) goto LAB_0014fc44;
        uVar11 = BitSource::readBits(&local_610,8);
        iVar10 = local_610._byteOffset;
        cVar26 = '\x01';
        bVar8 = false;
        switch(uVar11 - 0xe6) {
        case 0:
          bVar8 = true;
          pcVar29 = "*** 0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
          goto LAB_0014eb1b;
        case 1:
          iVar14 = BitSource::readBits(&local_610,8);
          iVar15 = iVar10 + 2;
          iVar23 = iVar10 * 0x95;
          iVar25 = (int)((ulong)((long)(iVar23 + 0x95) * -0x7f7f7f7f) >> 0x20) + iVar23 + 0x95;
          uVar11 = iVar14 + ~(iVar23 + ((iVar25 >> 7) - (iVar25 >> 0x1f)) * -0xff + 0x95U);
          uVar11 = (uVar11 >> 0x17 & 0x100) + uVar11;
          uVar27 = (ulong)uVar11;
          if (uVar11 == 0) {
            iVar14 = BitSource::available(&local_610);
            iVar10 = iVar14 + 7;
            if (-1 < iVar14) {
              iVar10 = iVar14;
            }
            uVar27 = (ulong)(uint)(iVar10 >> 3);
          }
          else if (0xf9 < (int)uVar11) {
            iVar14 = BitSource::readBits(&local_610,8);
            uVar12 = iVar14 + ~((iVar15 * 0x95) % 0xff);
            uVar27 = (ulong)(((uVar12 >> 0x17 & 0x100) + uVar11 * 0xfa + uVar12) - 0xf32a);
            iVar15 = iVar10 + 3;
          }
          if ((int)uVar27 < 0) {
            plVar20 = (long *)__cxa_allocate_exception(0x30);
            local_450 = &local_440;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_450,"invalid count in Base256 segment","");
            *plVar20 = (long)(plVar20 + 2);
            if (local_450 == &local_440) {
              *(uint *)(plVar20 + 2) = local_440;
              *(undefined4 *)((long)plVar20 + 0x14) = uStack_43c;
              *(undefined4 *)(plVar20 + 3) = uStack_438;
              *(undefined4 *)((long)plVar20 + 0x1c) = uStack_434;
            }
            else {
              *plVar20 = (long)local_450;
              plVar20[2] = CONCAT44(uStack_43c,local_440);
            }
            plVar20[1] = local_448;
            local_450 = &local_440;
            local_448 = 0;
            local_440 = local_440 & 0xffffff00;
            plVar20[4] = (long)"src/datamatrix/DMDecoder.cpp";
            *(undefined2 *)(plVar20 + 5) = 0x106;
            *(undefined1 *)((long)plVar20 + 0x2a) = 1;
            __cxa_throw(plVar20,&Error::typeinfo,Error::~Error);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5f8,
                     (size_type)
                     (local_5f8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                     (uVar27 - (long)local_5f8.bytes.
                                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
          if ((int)uVar27 != 0) {
            iVar15 = iVar15 * 0x95;
            do {
              iVar10 = BitSource::readBits(&local_610,8);
              Content::push_back(&local_5f8,(char)iVar10 + ~((char)(iVar15 / 0xff) + (char)iVar15));
              iVar15 = iVar15 + 0x95;
              uVar11 = (int)uVar27 - 1;
              uVar27 = (ulong)uVar11;
            } while (uVar11 != 0);
          }
          break;
        case 2:
          if (local_610._byteOffset == (int)local_318) {
            local_5f8.symbology.modifier = '2';
          }
          else {
            if (local_610._byteOffset != (int)local_318 + 1) {
              Content::push_back(&local_5f8,'\x1d');
              cVar26 = cVar22;
              bVar8 = false;
              goto switchD_0014e6a9_caseD_eb;
            }
            local_5f8.symbology.modifier = '3';
          }
          break;
        case 3:
          if (!bVar4) {
            plVar20 = (long *)__cxa_allocate_exception(0x30);
            local_490 = &local_480;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_490,"structured append tag must be first code word","");
            *plVar20 = (long)(plVar20 + 2);
            if (local_490 == &local_480) {
              *(uint *)(plVar20 + 2) = local_480;
              *(undefined4 *)((long)plVar20 + 0x14) = uStack_47c;
              *(undefined4 *)(plVar20 + 3) = uStack_478;
              *(undefined4 *)((long)plVar20 + 0x1c) = uStack_474;
            }
            else {
              *plVar20 = (long)local_490;
              plVar20[2] = CONCAT44(uStack_47c,local_480);
            }
            plVar20[1] = local_488;
            local_490 = &local_480;
            local_488 = 0;
            local_480 = local_480 & 0xffffff00;
            plVar20[4] = (long)"src/datamatrix/DMDecoder.cpp";
            *(undefined2 *)(plVar20 + 5) = 0x136;
            *(undefined1 *)((long)plVar20 + 0x2a) = 1;
            __cxa_throw(plVar20,&Error::typeinfo,Error::~Error);
          }
          uVar11 = BitSource::readBits(&local_610,8);
          local_350._4_4_ = 0x11 - (uVar11 & 0xf);
          if ((int)local_350._4_4_ <= (int)uVar11 >> 4) {
            local_350._4_4_ = 0;
          }
          if ((uVar11 & 0xf) == 0) {
            local_350._4_4_ = 0;
          }
          local_350._0_4_ = (int)uVar11 >> 4;
          iVar10 = BitSource::readBits(&local_610,8);
          uVar12 = BitSource::readBits(&local_610,8);
          uVar12 = uVar12 | iVar10 << 8;
          uVar11 = -uVar12;
          if (0 < (int)uVar12) {
            uVar11 = uVar12;
          }
          __len = 1;
          if (9 < uVar11) {
            uVar27 = (ulong)uVar11;
            uVar7 = 4;
            do {
              __len = uVar7;
              uVar13 = (uint)uVar27;
              if (uVar13 < 100) {
                __len = __len - 2;
                goto LAB_0014ee4a;
              }
              if (uVar13 < 1000) {
                __len = __len - 1;
                goto LAB_0014ee4a;
              }
              if (uVar13 < 10000) goto LAB_0014ee4a;
              uVar27 = uVar27 / 10000;
              uVar7 = __len + 4;
            } while (99999 < uVar13);
            __len = __len + 1;
          }
LAB_0014ee4a:
          local_1e8[0] = local_1d8;
          std::__cxx11::string::_M_construct
                    ((ulong)local_1e8,(char)__len - (char)((int)uVar12 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar12 >> 0x1f) + (long)local_1e8[0]),__len,uVar11);
          std::__cxx11::string::operator=((string *)&local_348,(string *)local_1e8);
          if (local_1e8[0] != local_1d8) {
            operator_delete(local_1e8[0],local_1d8[0] + 1);
          }
          local_318 = 5;
          break;
        case 4:
          bVar21 = true;
          cVar26 = cVar22;
          bVar8 = false;
          if (!bVar4) {
            plVar20 = (long *)__cxa_allocate_exception(0x30);
            local_4b0 = &local_4a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_4b0,"reader programming tag must be first code word","");
            *plVar20 = (long)(plVar20 + 2);
            if (local_4b0 == &local_4a0) {
              *(uint *)(plVar20 + 2) = local_4a0;
              *(undefined4 *)((long)plVar20 + 0x14) = uStack_49c;
              *(undefined4 *)(plVar20 + 3) = uStack_498;
              *(undefined4 *)((long)plVar20 + 0x1c) = uStack_494;
            }
            else {
              *plVar20 = (long)local_4b0;
              plVar20[2] = CONCAT44(uStack_49c,local_4a0);
            }
            plVar20[1] = local_4a8;
            local_4b0 = &local_4a0;
            local_4a8 = 0;
            local_4a0 = local_4a0 & 0xffffff00;
            plVar20[4] = (long)"src/datamatrix/DMDecoder.cpp";
            *(undefined2 *)(plVar20 + 5) = 0x13c;
            *(undefined1 *)((long)plVar20 + 0x2a) = 1;
            __cxa_throw(plVar20,&Error::typeinfo,Error::~Error);
          }
        case 5:
          goto switchD_0014e6a9_caseD_eb;
        case 6:
          local_5b8.field_2._M_allocated_capacity = 0x1d35301e3e295b;
          local_5b8._M_string_length = 7;
          local_5b8._M_dataplus._M_p = (pointer)paVar31;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_5f8,
                     local_5f8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,paVar31,
                     (undefined1 *)((long)&local_5b8.field_2 + 7));
          goto LAB_0014ea75;
        case 7:
          local_5b8.field_2._M_allocated_capacity = 0x1d36301e3e295b;
          local_5b8._M_string_length = 7;
          local_5b8._M_dataplus._M_p = (pointer)paVar31;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_5f8,
                     local_5f8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,paVar31,
                     (undefined1 *)((long)&local_5b8.field_2 + 7));
LAB_0014ea75:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8._M_dataplus._M_p != paVar31) {
            operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,0x193859);
          cVar26 = cVar22;
          bVar8 = false;
          goto switchD_0014e6a9_caseD_eb;
        case 8:
          local_248 = (_Optional_payload_base<std::array<int,_3UL>_>)
                      DecodedBitStreamParser::DecodeNextTriple(&local_610);
          if (((undefined1  [16])local_248 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0
             ) {
            lVar24 = 0;
            do {
              do {
                uVar11 = *(uint *)((long)&local_248._M_payload + lVar24);
                if ((long)(int)uVar11 < 0) {
                  plVar20 = (long *)__cxa_allocate_exception(0x30);
                  local_370 = &local_360;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_370,"invalid value in AnsiX12 segment","");
                  *plVar20 = (long)(plVar20 + 2);
                  if (local_370 == &local_360) {
                    *(uint *)(plVar20 + 2) = local_360;
                    *(undefined4 *)((long)plVar20 + 0x14) = uStack_35c;
                    *(undefined4 *)(plVar20 + 3) = uStack_358;
                    *(undefined4 *)((long)plVar20 + 0x1c) = uStack_354;
                  }
                  else {
                    *plVar20 = (long)local_370;
                    plVar20[2] = CONCAT44(uStack_35c,local_360);
                  }
                  plVar20[1] = local_368;
                  local_370 = &local_360;
                  local_368 = 0;
                  local_360 = local_360 & 0xffffff00;
                  plVar20[4] = (long)"src/datamatrix/DMDecoder.cpp";
                  *(undefined2 *)(plVar20 + 5) = 0xc4;
                  *(undefined1 *)((long)plVar20 + 0x2a) = 1;
                  __cxa_throw(plVar20,&Error::typeinfo,Error::~Error);
                }
                if (uVar11 < 4) {
                  uVar9 = *(uint8_t *)
                           ((long)&DecodedBitStreamParser::
                                   DecodeAnsiX12Segment(ZXing::BitSource&,ZXing::Content&)::segChars
                           + (long)(int)uVar11);
                }
                else if (uVar11 < 0xe) {
                  uVar9 = (char)uVar11 + ',';
                }
                else {
                  if (0x27 < uVar11) {
                    plVar20 = (long *)__cxa_allocate_exception(0x30);
                    local_430 = &local_420;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_430,"invalid value in AnsiX12 segment","");
                    *plVar20 = (long)(plVar20 + 2);
                    if (local_430 == &local_420) {
                      *(uint *)(plVar20 + 2) = local_420;
                      *(undefined4 *)((long)plVar20 + 0x14) = uStack_41c;
                      *(undefined4 *)(plVar20 + 3) = uStack_418;
                      *(undefined4 *)((long)plVar20 + 0x1c) = uStack_414;
                    }
                    else {
                      *plVar20 = (long)local_430;
                      plVar20[2] = CONCAT44(uStack_41c,local_420);
                    }
                    plVar20[1] = local_428;
                    local_430 = &local_420;
                    local_428 = 0;
                    local_420 = local_420 & 0xffffff00;
                    plVar20[4] = (long)"src/datamatrix/DMDecoder.cpp";
                    *(undefined2 *)(plVar20 + 5) = 0xcc;
                    *(undefined1 *)((long)plVar20 + 0x2a) = 1;
                    __cxa_throw(plVar20,&Error::typeinfo,Error::~Error);
                  }
                  uVar9 = (char)uVar11 + '3';
                }
                Content::push_back(&local_5f8,uVar9);
                lVar24 = lVar24 + 4;
              } while (lVar24 != 0xc);
              local_248 = (_Optional_payload_base<std::array<int,_3UL>_>)
                          DecodedBitStreamParser::DecodeNextTriple(&local_610);
              lVar24 = 0;
            } while (((undefined1  [16])local_248 & (undefined1  [16])0x100000000) !=
                     (undefined1  [16])0x0);
          }
          break;
        case 9:
          bVar8 = false;
          pcVar29 = "*** 0123456789abcdefghijklmnopqrstuvwxyz";
LAB_0014eb1b:
          local_238 = (_Optional_payload_base<std::array<int,_3UL>_>)
                      DecodedBitStreamParser::DecodeNextTriple(&local_610);
          if (((undefined1  [16])local_238 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0
             ) {
            lVar24 = 0;
            cVar26 = '\0';
            uVar11 = 0;
            do {
              do {
                if (3 < uVar11) {
                  plVar20 = (long *)__cxa_allocate_exception(0x30);
                  local_410 = &local_400;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_410,"invalid value in C40 or Text segment","");
                  *plVar20 = (long)(plVar20 + 2);
                  if (local_410 == &local_400) {
                    *(uint *)(plVar20 + 2) = local_400;
                    *(undefined4 *)((long)plVar20 + 0x14) = uStack_3fc;
                    *(undefined4 *)(plVar20 + 3) = uStack_3f8;
                    *(undefined4 *)((long)plVar20 + 0x1c) = uStack_3f4;
                  }
                  else {
                    *plVar20 = (long)local_410;
                    plVar20[2] = CONCAT44(uStack_3fc,local_400);
                  }
                  plVar20[1] = local_408;
                  local_410 = &local_400;
                  local_408 = 0;
                  local_400 = local_400 & 0xffffff00;
                  plVar20[4] = (long)"src/datamatrix/DMDecoder.cpp";
                  *(undefined2 *)(plVar20 + 5) = 0xb4;
                  *(undefined1 *)((long)plVar20 + 0x2a) = 1;
                  __cxa_throw(plVar20,&Error::typeinfo,Error::~Error);
                }
                uVar12 = *(uint *)((long)&local_238._M_payload + lVar24);
                switch(uVar11) {
                case 0:
                  if (2 < (int)uVar12) {
                    if (0x27 < uVar12) {
                      plVar20 = (long *)__cxa_allocate_exception(0x30);
                      local_3b0 = &local_3a0;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_3b0,"invalid value in C40 or Text segment","");
                      *plVar20 = (long)(plVar20 + 2);
                      if (local_3b0 == &local_3a0) {
                        *(uint *)(plVar20 + 2) = local_3a0;
                        *(undefined4 *)((long)plVar20 + 0x14) = uStack_39c;
                        *(undefined4 *)(plVar20 + 3) = uStack_398;
                        *(undefined4 *)((long)plVar20 + 0x1c) = uStack_394;
                      }
                      else {
                        *plVar20 = (long)local_3b0;
                        plVar20[2] = CONCAT44(uStack_39c,local_3a0);
                      }
                      plVar20[1] = local_3a8;
                      local_3b0 = &local_3a0;
                      local_3a8 = 0;
                      local_3a0 = local_3a0 & 0xffffff00;
                      plVar20[4] = (long)"src/datamatrix/DMDecoder.cpp";
                      *(undefined2 *)(plVar20 + 5) = 0xa1;
                      *(undefined1 *)((long)plVar20 + 0x2a) = 1;
                      __cxa_throw(plVar20,&Error::typeinfo,Error::~Error);
                    }
                    uVar9 = cVar26 * -0x80 + pcVar29[uVar12];
                    break;
                  }
                  uVar11 = uVar12 + 1;
                  goto LAB_0014ebfe;
                case 1:
                  uVar9 = cVar26 * -0x80 + (char)uVar12;
                  break;
                case 2:
                  if (0x1b < (int)uVar12) {
                    if (uVar12 != 0x1e) {
                      plVar20 = (long *)__cxa_allocate_exception(0x30);
                      local_3d0 = &local_3c0;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_3d0,"invalid value in C40 or Text segment","");
                      *plVar20 = (long)(plVar20 + 2);
                      if (local_3d0 == &local_3c0) {
                        *(uint *)(plVar20 + 2) = local_3c0;
                        *(undefined4 *)((long)plVar20 + 0x14) = uStack_3bc;
                        *(undefined4 *)(plVar20 + 3) = uStack_3b8;
                        *(undefined4 *)((long)plVar20 + 0x1c) = uStack_3b4;
                      }
                      else {
                        *plVar20 = (long)local_3d0;
                        plVar20[2] = CONCAT44(uStack_3bc,local_3c0);
                      }
                      plVar20[1] = local_3c8;
                      local_3d0 = &local_3c0;
                      local_3c8 = 0;
                      local_3c0 = local_3c0 & 0xffffff00;
                      plVar20[4] = (long)"src/datamatrix/DMDecoder.cpp";
                      *(undefined2 *)(plVar20 + 5) = 0xaa;
                      *(undefined1 *)((long)plVar20 + 0x2a) = 1;
                      __cxa_throw(plVar20,&Error::typeinfo,Error::~Error);
                    }
                    cVar26 = '\x01';
                    uVar11 = 0;
                    goto LAB_0014ebfe;
                  }
                  puVar19 = DecodedBitStreamParser::C40_SHIFT2_SET_CHARS;
LAB_0014ebd5:
                  uVar9 = cVar26 * -0x80 + puVar19[(int)uVar12];
                  break;
                case 3:
                  if (!bVar8) {
                    if (0x1f < (int)uVar12) {
                      plVar20 = (long *)__cxa_allocate_exception(0x30);
                      local_3f0 = &local_3e0;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_3f0,"invalid value in C40 or Text segment","");
                      *plVar20 = (long)(plVar20 + 2);
                      if (local_3f0 == &local_3e0) {
                        *(uint *)(plVar20 + 2) = local_3e0;
                        *(undefined4 *)((long)plVar20 + 0x14) = uStack_3dc;
                        *(undefined4 *)(plVar20 + 3) = uStack_3d8;
                        *(undefined4 *)((long)plVar20 + 0x1c) = uStack_3d4;
                      }
                      else {
                        *plVar20 = (long)local_3f0;
                        plVar20[2] = CONCAT44(uStack_3dc,local_3e0);
                      }
                      plVar20[1] = local_3e8;
                      local_3f0 = &local_3e0;
                      local_3e8 = 0;
                      local_3e0 = local_3e0 & 0xffffff00;
                      plVar20[4] = (long)"src/datamatrix/DMDecoder.cpp";
                      *(undefined2 *)(plVar20 + 5) = 0xb2;
                      *(undefined1 *)((long)plVar20 + 0x2a) = 1;
                      __cxa_throw(plVar20,&Error::typeinfo,Error::~Error);
                    }
                    puVar19 = DecodedBitStreamParser::TEXT_SHIFT3_SET_CHARS;
                    goto LAB_0014ebd5;
                  }
                  uVar9 = cVar26 * -0x80 + (char)uVar12 + '`';
                }
                uVar11 = 0;
                Content::push_back(&local_5f8,uVar9);
                cVar26 = '\0';
LAB_0014ebfe:
                lVar24 = lVar24 + 4;
              } while (lVar24 != 0xc);
              local_238 = (_Optional_payload_base<std::array<int,_3UL>_>)
                          DecodedBitStreamParser::DecodeNextTriple(&local_610);
              lVar24 = 0;
            } while (((undefined1  [16])local_238 & (undefined1  [16])0x100000000) !=
                     (undefined1  [16])0x0);
          }
          cVar26 = cVar22;
          bVar8 = false;
          goto switchD_0014e6a9_caseD_eb;
        case 10:
          iVar10 = BitSource::available(&local_610);
          iVar15 = 0;
          cVar26 = cVar22;
          bVar8 = false;
          if (iVar10 < 0x18) goto switchD_0014e6a9_caseD_eb;
          do {
            do {
              uVar11 = BitSource::readBits(&local_610,6);
              val = (byte)uVar11;
              if (val == 0x1f) {
                bVar8 = false;
                if (local_610._bitOffset != 0) {
                  BitSource::readBits(&local_610,8 - local_610._bitOffset);
                  bVar8 = false;
                }
                goto switchD_0014e6a9_caseD_eb;
              }
              if ((uVar11 & 0x20) == 0) {
                val = val | 0x40;
              }
              Content::push_back(&local_5f8,val);
              iVar15 = iVar15 + 1;
            } while (iVar15 != 4);
            iVar10 = BitSource::available(&local_610);
            iVar15 = 0;
          } while (0x17 < iVar10);
          break;
        case 0xb:
          uVar11 = BitSource::readBits(&local_610,8);
          if (0x7f < (int)uVar11) {
            iVar10 = BitSource::readBits(&local_610,8);
            if (uVar11 < 0xc0) {
              uVar11 = (uVar11 * 0xfe + iVar10) - 0x7e81;
            }
            else {
              iVar15 = BitSource::readBits(&local_610,8);
              uVar11 = (iVar15 + iVar10 * 0xfe + uVar11 * 0xfc04) - 0xbcc3ff;
            }
          }
          Content::switchEncoding(&local_5f8,uVar11 + Unknown,true);
          cVar26 = cVar22;
          bVar8 = false;
          goto switchD_0014e6a9_caseD_eb;
        default:
          if (uVar11 == 0x81) goto LAB_0014fc44;
          if (uVar11 == 0) {
            plVar20 = (long *)__cxa_allocate_exception(0x30);
            local_470 = &local_460;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_470,"invalid 0 code word","");
            *plVar20 = (long)(plVar20 + 2);
            if (local_470 == &local_460) {
              *(uint *)(plVar20 + 2) = local_460;
              *(undefined4 *)((long)plVar20 + 0x14) = uStack_45c;
              *(undefined4 *)(plVar20 + 3) = uStack_458;
              *(undefined4 *)((long)plVar20 + 0x1c) = uStack_454;
            }
            else {
              *plVar20 = (long)local_470;
              plVar20[2] = CONCAT44(uStack_45c,local_460);
            }
            plVar20[1] = local_468;
            local_470 = &local_460;
            local_468 = 0;
            local_460 = local_460 & 0xffffff00;
            plVar20[4] = (long)"src/datamatrix/DMDecoder.cpp";
            *(undefined2 *)(plVar20 + 5) = 0x125;
            *(undefined1 *)((long)plVar20 + 0x2a) = 1;
            __cxa_throw(plVar20,&Error::typeinfo,Error::~Error);
          }
          if ((int)uVar11 < 0x81) {
            Content::push_back(&local_5f8,(char)uVar11 + cVar22 * -0x80 + 0xff);
            cVar26 = '\0';
            bVar8 = false;
            goto switchD_0014e6a9_caseD_eb;
          }
          if (0xe5 < uVar11) {
            cVar26 = cVar22;
            bVar8 = false;
            if (0xf1 < uVar11) {
              if (uVar11 == 0xfe) {
                iVar10 = BitSource::available(&local_610);
                bVar8 = false;
                if (iVar10 == 0) goto switchD_0014e6a9_caseD_eb;
              }
              plVar20 = (long *)__cxa_allocate_exception(0x30);
              local_4d0 = &local_4c0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4d0,"invalid code word","");
              *plVar20 = (long)(plVar20 + 2);
              if (local_4d0 == &local_4c0) {
                *(uint *)(plVar20 + 2) = local_4c0;
                *(undefined4 *)((long)plVar20 + 0x14) = uStack_4bc;
                *(undefined4 *)(plVar20 + 3) = uStack_4b8;
                *(undefined4 *)((long)plVar20 + 0x1c) = uStack_4b4;
              }
              else {
                *plVar20 = (long)local_4d0;
                plVar20[2] = CONCAT44(uStack_4bc,local_4c0);
              }
              plVar20[1] = local_4c8;
              local_4d0 = &local_4c0;
              local_4c8 = 0;
              local_4c0 = local_4c0 & 0xffffff00;
              plVar20[4] = (long)"src/datamatrix/DMDecoder.cpp";
              *(undefined2 *)(plVar20 + 5) = 0x155;
              *(undefined1 *)((long)plVar20 + 0x2a) = 1;
              __cxa_throw(plVar20,&Error::typeinfo,Error::~Error);
            }
            goto switchD_0014e6a9_caseD_eb;
          }
          ToString<int,void>(&local_5b8,(ZXing *)(ulong)(uVar11 - 0x82),2,uVar11 - 0xe6);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_5f8,
                     local_5f8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,local_5b8._M_dataplus._M_p,
                     local_5b8._M_dataplus._M_p + local_5b8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8._M_dataplus._M_p != paVar31) {
            operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
          }
        }
        cVar26 = cVar22;
        bVar8 = false;
        goto switchD_0014e6a9_caseD_eb;
      }
      local_310 = &local_300;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_310,"Invalid number of data blocks","");
      paVar31 = &local_c0._msg.field_2;
      if (local_310 == &local_300) {
        local_c0._msg.field_2._8_8_ = local_300._8_8_;
        local_c0._msg._M_dataplus._M_p = (pointer)paVar31;
      }
      else {
        local_c0._msg._M_dataplus._M_p = (pointer)local_310;
      }
      local_c0._msg.field_2._M_allocated_capacity._1_7_ = local_300._M_allocated_capacity._1_7_;
      local_c0._msg.field_2._M_local_buf[0] = local_300._M_local_buf[0];
      local_c0._msg._M_string_length = local_308;
      local_308 = 0;
      local_300._M_local_buf[0] = '\0';
      local_c0._file = "src/datamatrix/DMDecoder.cpp";
      local_c0._line = 0x194;
      local_c0._type = Format;
      local_310 = &local_300;
      DecoderResult::DecoderResult(local_600,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._msg._M_dataplus._M_p != paVar31) {
        operator_delete(local_c0._msg._M_dataplus._M_p,
                        local_c0._msg.field_2._M_allocated_capacity + 1);
      }
      if (local_310 != &local_300) {
        operator_delete(local_310,
                        CONCAT71(local_300._M_allocated_capacity._1_7_,local_300._M_local_buf[0]) +
                        1);
      }
      std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::
      ~vector(&local_2f0);
      pDVar16 = extraout_RAX_04;
      goto LAB_00150485;
    }
    local_2d8 = &local_2c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d8,"Invalid number of code words","");
    paVar31 = &local_90._msg.field_2;
    if (local_2d8 == &local_2c8) {
      local_90._msg.field_2._8_8_ = local_2c8._8_8_;
      local_90._msg._M_dataplus._M_p = (pointer)paVar31;
    }
    else {
      local_90._msg._M_dataplus._M_p = (pointer)local_2d8;
    }
    local_90._msg.field_2._M_allocated_capacity._1_7_ = local_2c8._M_allocated_capacity._1_7_;
    local_90._msg.field_2._M_local_buf[0] = local_2c8._M_local_buf[0];
    local_90._msg._M_string_length = local_2d0;
    local_2d0 = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_90._file = "src/datamatrix/DMDecoder.cpp";
    local_90._line = 0x18d;
    local_90._type = Format;
    local_2d8 = &local_2c8;
    DecoderResult::DecoderResult(local_600,&local_90);
    pDVar16 = extraout_RAX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._msg._M_dataplus._M_p != paVar31) {
      operator_delete(local_90._msg._M_dataplus._M_p,local_90._msg.field_2._M_allocated_capacity + 1
                     );
      pDVar16 = extraout_RAX_02;
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
      pDVar16 = extraout_RAX_03;
    }
LAB_00150485:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return pDVar16;
    }
    uVar27 = (long)local_200.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_200.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  operator_delete(local_200.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start,uVar27);
  return extraout_RAX_05;
LAB_0014fc44:
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_5f8,
             local_5f8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,local_390,local_390 + local_388);
  SVar5 = local_5f8.symbology;
  cVar26 = local_5f8.symbology.modifier;
  bVar8 = local_5f8.symbology.modifier == '2';
  local_5f8.symbology.aiFlag = bVar8;
  cVar22 = '\0';
  if (local_4d4 < 0x12) {
    cVar22 = '\x06';
  }
  local_5f8.symbology.code = SVar5.code;
  local_5f8.symbology.modifier = cVar22 + cVar26;
  local_5b8._M_dataplus._M_p =
       (pointer)local_5f8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_5b8._M_string_length =
       (size_type)
       local_5f8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_5b8.field_2._M_allocated_capacity =
       (size_type)
       local_5f8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_5f8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (uchar *)0x0;
  local_5f8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_5f8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5b8.field_2._8_8_ =
       local_5f8.encodings.
       super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pEStack_598 = local_5f8.encodings.
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_590 = local_5f8.encodings.
              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_5f8.encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f8.encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f8.encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_584 = local_5f8.defaultCharset;
  bStack_583 = local_5f8.hasECI;
  local_588 = local_5f8.symbology;
  local_578 = 0;
  local_570._M_local_buf[0] = '\0';
  local_560._0_4_ = 0;
  local_560._4_4_ = 0;
  auStack_558 = (undefined1  [8])0xffffffffffffffff;
  local_550 = &local_540;
  local_548 = 0;
  local_540._M_local_buf[0] = '\0';
  local_530 = 0;
  local_528 = local_320;
  local_520 = 0;
  local_518._M_local_buf[0] = '\0';
  local_508 = 0;
  uStack_500 = 0xffff;
  uStack_4fe = 0;
  local_4f8 = (element_type *)0x0;
  p_Stack_4f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_580 = &local_570;
  std::__cxx11::string::operator=((string *)&local_528,(string *)&local_2b8);
  puVar6 = local_328;
  *(uint *)((long)local_328 + 7) = CONCAT13(uStack_28e,CONCAT21(uStack_290,uStack_291));
  *puVar6 = CONCAT17(uStack_291,local_298);
  auStack_558 = local_350;
  std::__cxx11::string::_M_assign((string *)&local_550);
  paVar31 = local_208;
  version = local_4e0;
  local_530._1_1_ = bVar21;
  local_198._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_5b8._M_dataplus._M_p;
  local_198._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_5b8._M_string_length;
  local_198._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_5b8.field_2._M_allocated_capacity;
  local_5b8._M_dataplus._M_p = (pointer)0x0;
  local_5b8._M_string_length = 0;
  local_5b8.field_2._M_allocated_capacity = 0;
  local_198._content.encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_5b8.field_2._8_8_;
  local_198._content.encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_finish = pEStack_598;
  local_198._content.encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_590;
  local_590 = (pointer)0x0;
  local_5b8.field_2._8_8_ = 0;
  pEStack_598 = (pointer)0x0;
  local_198._content.defaultCharset = local_584;
  local_198._content.hasECI = bStack_583;
  local_198._content.symbology = local_588;
  local_198._ecLevel._M_dataplus._M_p = (pointer)&local_198._ecLevel.field_2;
  if (local_580 == &local_570) {
    local_198._ecLevel.field_2._8_8_ = local_570._8_8_;
  }
  else {
    local_198._ecLevel._M_dataplus._M_p = (pointer)local_580;
  }
  local_198._ecLevel.field_2._M_allocated_capacity._1_7_ = local_570._M_allocated_capacity._1_7_;
  local_198._ecLevel.field_2._M_local_buf[0] = local_570._M_local_buf[0];
  local_198._ecLevel._M_string_length = local_578;
  local_578 = 0;
  local_570._M_local_buf[0] = '\0';
  local_198._lineCount = (int)local_560;
  local_198._versionNumber = local_560._4_4_;
  local_198._structuredAppend.index = auStack_558._0_4_;
  local_198._structuredAppend.count = auStack_558._4_4_;
  local_198._structuredAppend.id._M_dataplus._M_p = (pointer)&local_198._structuredAppend.id.field_2
  ;
  if (local_550 == &local_540) {
    local_198._structuredAppend.id.field_2._8_8_ = local_540._8_8_;
  }
  else {
    local_198._structuredAppend.id._M_dataplus._M_p = (pointer)local_550;
  }
  local_198._structuredAppend.id.field_2._M_allocated_capacity._1_7_ =
       local_540._M_allocated_capacity._1_7_;
  local_198._structuredAppend.id.field_2._M_local_buf[0] = local_540._M_local_buf[0];
  local_198._structuredAppend.id._M_string_length = local_548;
  local_548 = 0;
  local_540._M_local_buf[0] = '\0';
  local_198._isMirrored = local_530._0_1_;
  local_198._readerInit = bVar21;
  local_198._error._msg._M_dataplus._M_p = (pointer)local_208;
  if (local_528 == local_320) {
    sVar3 = *(size_type *)(local_320->_M_local_buf + 8);
    local_208->_M_allocated_capacity = local_320->_M_allocated_capacity;
    *(size_type *)(local_208->_M_local_buf + 8) = sVar3;
  }
  else {
    local_198._error._msg._M_dataplus._M_p = (pointer)local_528;
    local_198._error._msg.field_2._M_allocated_capacity =
         CONCAT71(local_518._M_allocated_capacity._1_7_,local_518._M_local_buf[0]);
  }
  local_198._error._msg._M_string_length = local_520;
  local_528 = local_320;
  local_520 = 0;
  local_518._M_local_buf[0] = '\0';
  *(undefined4 *)((long)local_210 + 7) = *(undefined4 *)((long)local_328 + 7);
  *local_210 = (char *)*local_328;
  local_198._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_4f8;
  local_198._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Stack_4f0;
  local_580 = &local_570;
  local_550 = &local_540;
  if (local_348 != &local_338) {
    operator_delete(local_348,CONCAT71(uStack_337,local_338) + 1);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390,CONCAT71(uStack_37f,local_380) + 1);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,CONCAT71(uStack_2a7,local_2a8) + 1);
  }
  if (local_5f8.encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f8.encodings.
                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5f8.encodings.
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5f8.encodings.
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5f8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_5f8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5f8.bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5f8.bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_198._versionNumber = version->versionNumber;
  DecoderResult::DecoderResult(local_600,&local_198);
  if (local_198._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._error._msg._M_dataplus._M_p != paVar31) {
    operator_delete(local_198._error._msg._M_dataplus._M_p,
                    local_198._error._msg.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._structuredAppend.id._M_dataplus._M_p != &local_198._structuredAppend.id.field_2)
  {
    operator_delete(local_198._structuredAppend.id._M_dataplus._M_p,
                    local_198._structuredAppend.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._ecLevel._M_dataplus._M_p != &local_198._ecLevel.field_2) {
    operator_delete(local_198._ecLevel._M_dataplus._M_p,
                    local_198._ecLevel.field_2._M_allocated_capacity + 1);
  }
  if (local_198._content.encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198._content.encodings.
                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_198._content.encodings.
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198._content.encodings.
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    uVar27 = (long)local_198._content.bytes.
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_198._content.bytes.
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    puVar28 = local_198._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
LAB_0015014c:
    operator_delete(puVar28,uVar27);
  }
LAB_00150151:
  bVar8 = false;
  pDVar16 = (DecoderResult *)((ulong)local_5c0 & 0xffffffff);
LAB_0015015a:
  if (local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::~vector
            (&local_2f0);
  if (!bVar8) goto LAB_00150485;
  goto LAB_0014e41b;
}

Assistant:

static DecoderResult DoDecode(const BitMatrix& bits)
{
	// Construct a parser and read version, error-correction level
	const Version* version = VersionForDimensionsOf(bits);
	if (version == nullptr)
		return FormatError("Invalid matrix dimension");

	// Read codewords
	ByteArray codewords = CodewordsFromBitMatrix(bits, *version);
	if (codewords.empty())
		return FormatError("Invalid number of code words");

	bool fix259 = false; // see https://github.com/zxing-cpp/zxing-cpp/issues/259
retry:
	// Separate into data blocks
	std::vector<DataBlock> dataBlocks = GetDataBlocks(codewords, *version, fix259);
	if (dataBlocks.empty())
		return FormatError("Invalid number of data blocks");

	// Count total number of data bytes
	ByteArray resultBytes(TransformReduce(dataBlocks, 0, [](const auto& db) { return db.numDataCodewords; }));

	// Error-correct and copy data blocks together into a stream of bytes
	const int dataBlocksCount = Size(dataBlocks);
	for (int j = 0; j < dataBlocksCount; j++) {
		auto& [numDataCodewords, codewords] = dataBlocks[j];
		if (!CorrectErrors(codewords, numDataCodewords)) {
			if(version->versionNumber == 24 && !fix259) {
				fix259 = true;
				goto retry;
			}
			return ChecksumError();
		}

		for (int i = 0; i < numDataCodewords; i++) {
			// De-interlace data blocks.
			resultBytes[i * dataBlocksCount + j] = codewords[i];
		}
	}
#ifdef PRINT_DEBUG
	if (fix259)
		printf("-> needed retry with fix259 for 144x144 symbol\n");
#endif

	// Decode the contents of that stream of bytes
	return DecodedBitStreamParser::Decode(std::move(resultBytes), version->isDMRE())
		.setVersionNumber(version->versionNumber);
}